

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collectives.cpp
# Opt level: O0

void diy::mpi::detail::gather
               (communicator *comm,void *dataIn,int count,datatype *type,void *dataOut,int root)

{
  MPI_Datatype poVar1;
  MPI_Datatype poVar2;
  MPI_Datatype *ppoVar3;
  MPI_Comm *ppoVar4;
  DIY_MPI_Datatype *in_RCX;
  undefined4 in_EDX;
  undefined8 in_RSI;
  communicator *in_RDI;
  undefined8 in_R8;
  undefined4 in_R9D;
  DIY_MPI_Comm local_38;
  undefined4 local_2c;
  undefined8 local_28;
  DIY_MPI_Datatype *local_20;
  undefined4 local_14;
  communicator *local_8;
  
  local_2c = in_R9D;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_14 = in_EDX;
  local_8 = in_RDI;
  ppoVar3 = mpi_cast(in_RCX);
  poVar1 = *ppoVar3;
  ppoVar3 = mpi_cast(local_20);
  poVar2 = *ppoVar3;
  local_38 = communicator::handle(local_8);
  ppoVar4 = mpi_cast(&local_38);
  MPI_Gather(in_RSI,in_EDX,poVar1,local_28,local_14,poVar2,local_2c,*ppoVar4);
  return;
}

Assistant:

void gather(const communicator& comm,
            const void* dataIn, int count, const datatype& type, void* dataOut,
            int root)
{
#if DIY_HAS_MPI
  MPI_Gather(dataIn, count, mpi_cast(type.handle),
             dataOut, count, mpi_cast(type.handle),
             root, mpi_cast(comm.handle()));
#else
  copy_buffer(dataIn, dataOut, mpi_cast(type.handle), count);
  (void)comm; (void)root;
#endif
}